

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lira_literal.h
# Opt level: O0

bool __thiscall
viras::
LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
::lim(LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
      *this,Infty i)

{
  uint uVar1;
  byte in_SIL;
  long in_RDI;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  int in_stack_ffffffffffffff9c;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *in_stack_ffffffffffffffa0;
  undefined1 local_1;
  
  uVar1 = *(uint *)(in_RDI + 0xf8);
  if (uVar1 < 2) {
    if ((in_SIL & 1) == 0) {
      Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
      ::Numeral((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                 *)CONCAT17(in_stack_ffffffffffffff67,
                            CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
                in_stack_ffffffffffffff58);
      local_1 = sugar::operator<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
      ::~Numeral((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                  *)0x65b7cc);
    }
    else {
      Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
      ::Numeral((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                 *)CONCAT17(in_stack_ffffffffffffff67,
                            CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
                in_stack_ffffffffffffff58);
      local_1 = sugar::operator>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
      ::~Numeral((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                  *)0x65b7df);
    }
  }
  else if (uVar1 == 2) {
    local_1 = true;
  }
  else {
    if (uVar1 != 3) {
      do {
      } while( true );
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool lim(Infty i) const
    { 
      VIRAS_ASSERT(term.oslp != 0);
      switch (symbol) {
      case PredSymbol::Gt:
      case PredSymbol::Geq: return i.positive ? term.oslp > 0 
                                              : term.oslp < 0;
      case PredSymbol::Neq: return true;
      case PredSymbol::Eq: return false;
      }
      VIRAS_UNREACHABLE
    }